

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O1

cmCommand * __thiscall cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x40);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1[1]._vptr_cmCommand = (_func_int **)0x0;
  pcVar1[1].Makefile = (cmMakefile *)0x0;
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00787f98;
  pcVar1[1]._vptr_cmCommand = (_func_int **)(this->super_cmCTestCommand).CTest;
  pcVar1[1].Makefile = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  return pcVar1;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestRunScriptCommand* ni = new cmCTestRunScriptCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }